

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cc
# Opt level: O3

unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> __thiscall
flow::lang::Parser::postscriptStmt
          (Parser *this,
          unique_ptr<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_> *baseStmt)

{
  int iVar1;
  Stmt *pSVar2;
  long lVar3;
  size_type sVar4;
  Stmt *this_00;
  undefined8 uVar5;
  Runtime *pRVar6;
  bool bVar7;
  Opcode OVar8;
  LiteralType args;
  pointer __dest;
  Expr *pEVar9;
  undefined8 *puVar10;
  undefined8 *in_RDX;
  Expr *pEVar11;
  SourceLocation sloc;
  size_type __dnew;
  string local_98;
  Expr *local_78;
  _Base_ptr *local_70;
  _Base_ptr local_68;
  _Base_ptr local_60 [2];
  size_t local_50;
  undefined4 uStack_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  Runtime *local_38;
  
  pSVar2 = baseStmt[6]._M_t.
           super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
           super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
           super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
  iVar1 = *(int *)((long)&pSVar2[2].super_ASTNode.location_.filename.field_2 + 8);
  if ((iVar1 != 0x3a) && (iVar1 != 0x3d)) {
    *(undefined8 *)&(this->features_)._M_t._M_impl = *in_RDX;
    *in_RDX = 0;
    return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
           (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
           this;
  }
  local_70 = local_60;
  lVar3 = *(long *)&pSVar2[1].super_ASTNode.location_.begin;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,lVar3,
             *(long *)&pSVar2[1].super_ASTNode.location_.begin.offset + lVar3);
  sVar4 = pSVar2[2].super_ASTNode.location_.filename.field_2._M_allocated_capacity;
  uStack_40 = (undefined4)sVar4;
  uStack_3c = (undefined4)(sVar4 >> 0x20);
  local_50 = *(size_t *)&pSVar2[2].super_ASTNode.location_.filename._M_dataplus;
  sVar4 = pSVar2[2].super_ASTNode.location_.filename._M_string_length;
  uStack_48 = (undefined4)sVar4;
  uStack_44 = (undefined4)(sVar4 >> 0x20);
  Lexer::nextToken((Lexer *)baseStmt[6]._M_t.
                            super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>
                            .super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl);
  logicExpr((Parser *)&local_78);
  pEVar11 = local_78;
  if (local_78 == (Expr *)0x0) {
    *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
    goto LAB_001304ac;
  }
  if (iVar1 == 0x3d) {
    OVar8 = makeOperator(Not,local_78);
    if (OVar8 != EXIT) {
      pEVar9 = (Expr *)operator_new(0x50);
      (pEVar9->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR__ASTNode_001ae890;
      (pEVar9->super_ASTNode).location_.filename._M_dataplus._M_p =
           (pointer)&(pEVar9->super_ASTNode).location_.filename.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&(pEVar9->super_ASTNode).location_,local_70,
                 (long)&local_68->_M_color + (long)local_70);
      (pEVar9->super_ASTNode).location_.end.column = uStack_40;
      (pEVar9->super_ASTNode).location_.end.offset = uStack_3c;
      (pEVar9->super_ASTNode).location_.begin.line = (undefined4)local_50;
      (pEVar9->super_ASTNode).location_.begin.column = local_50._4_4_;
      *(ulong *)&(pEVar9->super_ASTNode).location_.begin.offset = CONCAT44(uStack_44,uStack_48);
      (pEVar9->super_ASTNode)._vptr_ASTNode = (_func_int **)&PTR__UnaryExpr_001aec28;
      *(Opcode *)&pEVar9[1].super_ASTNode._vptr_ASTNode = OVar8;
      pEVar9[1].super_ASTNode.location_.filename._M_dataplus._M_p = (pointer)pEVar11;
      local_78 = pEVar9;
      goto LAB_001303e5;
    }
    pSVar2 = baseStmt[6]._M_t.
             super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
             super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
             super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
    this_00 = baseStmt[0xd]._M_t.
              super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
              super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
              super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_38 = (Runtime *)0x4f;
    __dest = (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_38);
    pRVar6 = local_38;
    local_98.field_2._M_allocated_capacity = (size_type)local_38;
    local_98._M_dataplus._M_p = __dest;
    memcpy(__dest,"Type cast error. No cast implementation found for requested cast from {} to {}.",
           0x4f);
    local_98._M_string_length = (size_type)pRVar6;
    __dest[(long)pRVar6] = '\0';
    args = (*(pEVar11->super_ASTNode)._vptr_ASTNode[3])(pEVar11);
    diagnostics::Report::typeError<flow::LiteralType,flow::LiteralType>
              ((Report *)this_00,(SourceLocation *)&(pSVar2->super_ASTNode).location_.begin.offset,
               &local_98,args,Boolean);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
  }
  else {
LAB_001303e5:
    pEVar11 = local_78;
    bVar7 = expect((Parser *)baseStmt,Semicolon);
    if (bVar7) {
      Lexer::nextToken((Lexer *)baseStmt[6]._M_t.
                                super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>
                                .super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl);
      pSVar2 = baseStmt[6]._M_t.
               super___uniq_ptr_impl<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>_>._M_t.
               super__Tuple_impl<0UL,_flow::lang::Stmt_*,_std::default_delete<flow::lang::Stmt>_>.
               super__Head_base<0UL,_flow::lang::Stmt_*,_false>._M_head_impl;
      uStack_3c = *(undefined4 *)((long)&pSVar2[1].super_ASTNode.location_.filename.field_2 + 0xc);
      uVar5 = *(undefined8 *)((long)&pSVar2[1].super_ASTNode.location_.filename.field_2 + 4);
      uStack_44 = (undefined4)uVar5;
      uStack_40 = (undefined4)((ulong)uVar5 >> 0x20);
      puVar10 = (undefined8 *)operator_new(0x58);
      uVar5 = *in_RDX;
      *in_RDX = 0;
      *puVar10 = &PTR__ASTNode_001ae890;
      puVar10[1] = puVar10 + 3;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(puVar10 + 1),local_70,(long)&local_68->_M_color + (long)local_70);
      puVar10[7] = CONCAT44(uStack_3c,uStack_40);
      puVar10[5] = local_50;
      puVar10[6] = CONCAT44(uStack_44,uStack_48);
      *puVar10 = &PTR__CondStmt_001aee50;
      puVar10[8] = pEVar11;
      puVar10[9] = uVar5;
      puVar10[10] = 0;
      *(undefined8 **)&(this->features_)._M_t._M_impl = puVar10;
      goto LAB_001304ac;
    }
  }
  *(undefined8 *)&(this->features_)._M_t._M_impl = 0;
  (*(pEVar11->super_ASTNode)._vptr_ASTNode[1])(pEVar11);
LAB_001304ac:
  if (local_70 != local_60) {
    operator_delete(local_70,(ulong)((long)&local_60[0]->_M_color + 1));
  }
  return (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)
         (__uniq_ptr_data<flow::lang::Stmt,_std::default_delete<flow::lang::Stmt>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Stmt> Parser::postscriptStmt(
    std::unique_ptr<Stmt> baseStmt) {
  Token op = token();
  switch (op) {
    case Token::If:
    case Token::Unless:
      break;
    default:
      return baseStmt;
  }

  // STMT ['if' EXPR] ';'
  // STMT ['unless' EXPR] ';'

  SourceLocation sloc = location();

  nextToken();  // 'if' | 'unless'

  std::unique_ptr<Expr> condExpr = expr();
  if (!condExpr) return nullptr;

  if (op == Token::Unless) {
    auto opc = makeOperator(Token::Not, condExpr.get());
    if (opc == Opcode::EXIT) {
      report_.typeError(
          lastLocation(),
          "Type cast error. No cast implementation found for requested cast "
          "from {} to {}.",
          condExpr->getType(), LiteralType::Boolean);
      return nullptr;
    }

    condExpr = std::make_unique<UnaryExpr>(opc, std::move(condExpr), sloc);
  }

  if (!consume(Token::Semicolon)) return nullptr;

  return std::make_unique<CondStmt>(std::move(condExpr), std::move(baseStmt),
                                    nullptr, sloc.update(end()));
}